

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos,ImGuiDockNode *dock_node)

{
  byte bVar1;
  bool bVar2;
  ImU32 IVar3;
  float sz;
  long in_RDX;
  ImGuiDockNode *in_RSI;
  ImVec2 IVar4;
  float in_stack_0000002c;
  ImGuiDir in_stack_00000030;
  ImU32 in_stack_00000034;
  ImDrawList *in_stack_00000038;
  ImVec2 in_stack_00000040;
  ImVec2 center;
  ImU32 text_col;
  ImU32 bg_col;
  ImVec2 off;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_ffffffffffffff28;
  ImDrawList *pIVar5;
  float lock_threshold;
  ImGuiMouseButton button;
  undefined8 in_stack_ffffffffffffff30;
  ImVec2 *pIVar6;
  undefined8 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined1 undock_floating_node;
  undefined4 in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  float col;
  float in_stack_ffffffffffffff9c;
  undefined5 in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa6;
  byte in_stack_ffffffffffffffa7;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImRect local_38;
  ImGuiWindow *local_28;
  ImGuiContext *local_20;
  long local_18;
  
  local_20 = GImGui;
  local_28 = GImGui->CurrentWindow;
  pIVar6 = &local_50;
  local_18 = in_RDX;
  ImVec2::ImVec2(pIVar6,GImGui->FontSize,GImGui->FontSize);
  local_48 = ::operator+(&in_stack_ffffffffffffff28->Min,(ImVec2 *)0x201b18);
  ::operator*(&in_stack_ffffffffffffff28->Min,0.0);
  local_40 = ::operator+(&in_stack_ffffffffffffff28->Min,(ImVec2 *)0x201b5b);
  ImRect::ImRect(&local_38,(ImVec2 *)in_RSI,&local_40);
  ItemAdd((ImRect *)in_RSI,(ImGuiID)((ulong)pIVar6 >> 0x20),
          (ImRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  undock_floating_node = (undefined1)((ulong)pIVar6 >> 0x38);
  bVar1 = ButtonBehavior((ImRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (ImGuiID)in_stack_ffffffffffffff74,
                         (bool *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (bool *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (ImGuiButtonFlags)((ulong)in_RSI >> 0x20));
  if (local_18 == 0) {
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff9c,0.0,0.0);
  }
  else {
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff9c,
                   (float)(int)(-(local_20->Style).ItemInnerSpacing.x * 0.5) + 0.5,0.0);
  }
  IVar3 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                      (float)in_stack_ffffffffffffff40);
  sz = (float)GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                          (float)in_stack_ffffffffffffff40);
  IVar4 = ImRect::GetCenter(in_stack_ffffffffffffff28);
  col = IVar4.y;
  if (((in_stack_ffffffffffffffa7 & 1) != 0) || ((in_stack_ffffffffffffffa6 & 1) != 0)) {
    pIVar5 = local_28->DrawList;
    ::operator+(&in_stack_ffffffffffffff28->Min,(ImVec2 *)0x201cc9);
    pIVar6 = (ImVec2 *)&stack0xffffffffffffff74;
    ImVec2::ImVec2(pIVar6,0.0,-0.5);
    ::operator+(&in_stack_ffffffffffffff28->Min,(ImVec2 *)0x201cf8);
    ImDrawList::AddCircleFilled
              (pIVar5,pIVar6,(float)((ulong)in_stack_ffffffffffffff30 >> 0x20),
               (ImU32)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  }
  button = (ImGuiMouseButton)in_stack_ffffffffffffff30;
  if (local_18 == 0) {
    pIVar5 = local_28->DrawList;
    IVar4 = ::operator+((ImVec2 *)pIVar5,(ImVec2 *)0x201dd4);
    lock_threshold = (float)((ulong)pIVar5 >> 0x20);
    in_stack_ffffffffffffff64 = IVar4.x;
    RenderArrow(in_stack_00000038,in_stack_00000040,in_stack_00000034,in_stack_00000030,
                in_stack_0000002c);
  }
  else {
    button = (ImGuiMouseButton)local_28->DrawList;
    ::operator+(&in_stack_ffffffffffffff28->Min,(ImVec2 *)0x201d79);
    lock_threshold = (float)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    IVar4.y._1_1_ = bVar1;
    IVar4._0_5_ = in_stack_ffffffffffffffa0;
    IVar4.y._2_1_ = in_stack_ffffffffffffffa6;
    IVar4.y._3_1_ = in_stack_ffffffffffffffa7;
    RenderArrowDockMenu((ImDrawList *)CONCAT44(in_stack_ffffffffffffff9c,IVar3),IVar4,sz,(ImU32)col)
    ;
  }
  bVar2 = IsItemActive();
  if ((bVar2) && (bVar2 = IsMouseDragging(button,lock_threshold), bVar2)) {
    StartMouseMovingWindowOrNode
              ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_RSI,
               (bool)undock_floating_node);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos, ImGuiDockNode* dock_node)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    //bool is_dock_menu = (window->DockNodeAsHost && !window->Collapsed);
    ImVec2 off = dock_node ? ImVec2(IM_FLOOR(-g.Style.ItemInnerSpacing.x * 0.5f) + 0.5f, 0.0f) : ImVec2(0.0f, 0.0f);
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImVec2 center = bb.GetCenter();
    if (hovered || held)
        window->DrawList->AddCircleFilled(center + off + ImVec2(0,-0.5f), g.FontSize * 0.5f + 1.0f, bg_col, 12);

    if (dock_node)
        RenderArrowDockMenu(window->DrawList, bb.Min + g.Style.FramePadding, g.FontSize, text_col);
    else
        RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindowOrNode(window, dock_node, true);

    return pressed;
}